

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QStyleOptionViewItem * __thiscall
QItemDelegate::setOptions
          (QStyleOptionViewItem *__return_storage_ptr__,QItemDelegate *this,QModelIndex *index,
          QStyleOptionViewItem *option)

{
  undefined4 uVar1;
  QAbstractItemModel *pQVar2;
  QMetaTypeInterface *pQVar3;
  InterfaceType *pIVar4;
  bool bVar5;
  char cVar6;
  QFlags<Qt::AlignmentFlag> QVar7;
  QMetaType QVar8;
  anon_union_24_3_e3d07ef4_for_data *paVar9;
  long in_FS_OFFSET;
  QBrush t;
  QMetaType local_88;
  undefined1 *puStack_80;
  InterfaceType *local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(__return_storage_ptr__,option);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x2;
  }
  else {
    paVar9 = &local_58;
    (**(code **)(*(long *)pQVar2 + 0x90))(paVar9,pQVar2,index,6);
    if ((undefined1 *)0x3 < puStack_40) {
      local_78 = &QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
      local_88.d_ptr = (QMetaTypeInterface *)((ulong)puStack_40 & 0xfffffffffffffffc);
      bVar5 = comparesEqual(&local_88,(QMetaType *)&local_78);
      if (bVar5) {
        if (((ulong)puStack_40 & 1) == 0) {
          paVar9 = &local_58;
        }
        else {
          paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_58.shared + *(int *)(local_58.shared + 4));
        }
        QFont::QFont((QFont *)&local_88,(QFont *)paVar9->data);
      }
      else {
        local_88.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)&local_88);
        QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_40 & 1) != 0) {
          paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_58.shared + *(int *)(local_58.shared + 4));
        }
        QMetaType::convert(QVar8,paVar9,(QMetaType)local_78,&local_88);
      }
      QFont::resolve((QFont *)&local_78);
      pQVar3 = *(QMetaTypeInterface **)&__return_storage_ptr__->font;
      *(InterfaceType **)&__return_storage_ptr__->font = local_78;
      uVar1 = *(undefined4 *)&__return_storage_ptr__->field_0x60;
      *(undefined4 *)&__return_storage_ptr__->field_0x60 = uStack_70;
      uStack_70 = uVar1;
      local_78 = pQVar3;
      QFont::~QFont((QFont *)&local_78);
      QFont::~QFont((QFont *)&local_88);
      QFontMetrics::QFontMetrics((QFontMetrics *)&local_78,&__return_storage_ptr__->font);
      pIVar4 = *(InterfaceType **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics;
      *(InterfaceType **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics = local_78;
      local_78 = pIVar4;
      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_78);
    }
    pQVar2 = (index->m).ptr;
    if (pQVar2 != (QAbstractItemModel *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0x90))(&local_78,pQVar2,index,7);
      goto LAB_00557b19;
    }
  }
  local_78 = (InterfaceType *)0x0;
  _uStack_70 = 0;
  local_68 = 0;
  local_60 = 2;
LAB_00557b19:
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  if ((undefined1 *)0x3 < puStack_40) {
    QVar7 = QtPrivate::legacyFlagValueFromModelData<QFlags<Qt::AlignmentFlag>>
                      ((QVariant *)&local_58);
    (__return_storage_ptr__->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (Int)QVar7.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_78 = (InterfaceType *)0x0;
    _uStack_70 = 0;
    local_68 = 0;
    local_60 = 2;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x90))(&local_78,pQVar2,index,9);
  }
  paVar9 = &local_58;
  ::QVariant::operator=((QVariant *)paVar9,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  cVar6 = QMetaType::canConvert
                    ((QMetaTypeInterface *)((ulong)puStack_40 & 0xfffffffffffffffc),
                     (QMetaType)0x7ebf88);
  if (cVar6 != '\0') {
    local_78 = &QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    local_88.d_ptr = (QMetaTypeInterface *)((ulong)puStack_40 & 0xfffffffffffffffc);
    bVar5 = comparesEqual(&local_88,(QMetaType *)&local_78);
    if (bVar5) {
      if (((ulong)puStack_40 & 1) == 0) {
        paVar9 = &local_58;
      }
      else {
        paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QBrush::QBrush((QBrush *)&local_88,(QBrush *)paVar9->data);
    }
    else {
      local_88.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
      QBrush::QBrush((QBrush *)&local_88);
      QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_40 & 1) != 0) {
        paVar9 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar8,paVar9,(QMetaType)local_78,&local_88);
    }
    QPalette::setBrush((int)__return_storage_ptr__ + 0x28,Mid,(QBrush *)0x6);
    QBrush::~QBrush((QBrush *)&local_88);
  }
  (__return_storage_ptr__->super_QStyleOption).styleObject = (QObject *)0x0;
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionViewItem QItemDelegate::setOptions(const QModelIndex &index,
                                               const QStyleOptionViewItem &option) const
{
    QStyleOptionViewItem opt = option;

    // set font
    QVariant value = index.data(Qt::FontRole);
    if (value.isValid()){
        opt.font = qvariant_cast<QFont>(value).resolve(opt.font);
        opt.fontMetrics = QFontMetrics(opt.font);
    }

    // set text alignment
    value = index.data(Qt::TextAlignmentRole);
    if (value.isValid())
        opt.displayAlignment = QtPrivate::legacyFlagValueFromModelData<Qt::Alignment>(value);

    // set foreground brush
    value = index.data(Qt::ForegroundRole);
    if (value.canConvert<QBrush>())
        opt.palette.setBrush(QPalette::Text, qvariant_cast<QBrush>(value));

    // disable style animations for checkboxes etc. within itemviews (QTBUG-30146)
    opt.styleObject = nullptr;

    return opt;
}